

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniFlags_Test::TestBody(TApp_IniFlags_Test *this)

{
  App *this_00;
  ostream *poVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d0;
  AssertHelper local_3c8;
  bool five;
  bool four;
  bool three;
  int two;
  TempFile tmpini;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  ofstream out;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210 [63];
  
  std::__cxx11::string::string((string *)&local_238,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_258,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_278,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_298,"Read an ini file",(allocator *)&local_3d0);
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_258,&local_278,&local_298,false);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar1 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"two=2");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"three=true");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"four=on");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&out,"five");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::string((string *)&local_2b8,"--two",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_2d8,"",(allocator *)&local_3d0);
  CLI::App::add_flag<int,_(CLI::detail::enabler)0>(this_00,&local_2b8,&two,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string((string *)&local_2f8,"--three",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_318,"",(allocator *)&local_3d0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_2f8,&three,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_338,"--four",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_358,"",(allocator *)&local_3d0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_338,&four,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string((string *)&local_378,"--five",(allocator *)&out);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_398,"",(allocator *)&local_3d0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_378,&five,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  TApp::run(&this->super_TApp);
  local_3d0.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"2","two",(int *)&local_3d0,&two);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d0);
    if (local_210[0].ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x221,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  local_3d0.ptr_._0_4_ = CONCAT31(local_3d0.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&out,"true","three",(bool *)&local_3d0,&three);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d0);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  local_3d0.ptr_._0_4_ = CONCAT31(local_3d0.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>((internal *)&out,"true","four",(bool *)&local_3d0,&four)
  ;
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d0);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x223,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  local_3d0.ptr_._0_4_ = CONCAT31(local_3d0.ptr_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>((internal *)&out,"true","five",(bool *)&local_3d0,&five)
  ;
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3d0);
    if (local_210[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_210[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x224,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_210);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniFlags) {
    TempFile tmpini{"TestIniTmp.ini"};
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=2" << std::endl;
        out << "three=true" << std::endl;
        out << "four=on" << std::endl;
        out << "five" << std::endl;
    }

    int two;
    bool three, four, five;
    app.add_flag("--two", two);
    app.add_flag("--three", three);
    app.add_flag("--four", four);
    app.add_flag("--five", five);

    run();

    EXPECT_EQ(2, two);
    EXPECT_EQ(true, three);
    EXPECT_EQ(true, four);
    EXPECT_EQ(true, five);
}